

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O3

int Aig_ManPackAddPatternTry(Aig_ManPack_t *p,int iBit,Vec_Int_t *vLits)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  long lVar7;
  byte bVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  iVar2 = vLits->nSize;
  if (0 < (long)iVar2) {
    lVar7 = (long)(iBit >> 5);
    bVar8 = (byte)iBit & 0x1f;
    lVar9 = 0;
    do {
      uVar3 = vLits->pArray[lVar9];
      if ((int)uVar3 < 0) goto LAB_00638d6f;
      uVar10 = uVar3 >> 1;
      if ((p->vPiPats->nSize <= (int)uVar10) || (p->vPiCare->nSize <= (int)uVar10))
      goto LAB_00638d50;
      if (((*(uint *)((long)p->vPiCare->pArray + lVar7 * 4 + (ulong)uVar10 * 8) & 1 << bVar8) != 0)
         && (((*(uint *)((long)p->vPiPats->pArray + lVar7 * 4 + (ulong)uVar10 * 8) >> bVar8 ^ uVar3)
             & 1) == 0)) {
        return 0;
      }
      lVar9 = lVar9 + 1;
    } while (iVar2 != lVar9);
    if (0 < iVar2) {
      piVar4 = vLits->pArray;
      pVVar5 = p->vPiPats;
      lVar9 = 0;
      do {
        uVar3 = piVar4[lVar9];
        if ((int)uVar3 < 0) {
LAB_00638d6f:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar10 = uVar3 >> 1;
        if ((pVVar5->nSize <= (int)uVar10) || (p->vPiCare->nSize <= (int)uVar10)) {
LAB_00638d50:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        lVar11 = (ulong)uVar10 * 8;
        pwVar6 = pVVar5->pArray;
        puVar1 = (uint *)((long)p->vPiCare->pArray + lVar7 * 4 + lVar11);
        *puVar1 = *puVar1 | 1 << bVar8;
        uVar10 = *(uint *)((long)pwVar6 + lVar7 * 4 + lVar11);
        if (((uVar10 >> bVar8 ^ uVar3) & 1) == 0) {
          *(uint *)((long)pwVar6 + lVar7 * 4 + lVar11) = uVar10 ^ 1 << bVar8;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < vLits->nSize);
    }
  }
  return 1;
}

Assistant:

int Aig_ManPackAddPatternTry( Aig_ManPack_t * p, int iBit, Vec_Int_t * vLits )
{
    word * pInfo, * pPres;
    int i, Lit;
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        if ( Abc_InfoHasBit( (unsigned *)pPres, iBit ) && 
             Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             return 0;
    }
    Vec_IntForEachEntry( vLits, Lit, i )
    {
        pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
        pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
        Abc_InfoSetBit( (unsigned *)pPres, iBit );
        if ( Abc_InfoHasBit( (unsigned *)pInfo, iBit ) == Abc_LitIsCompl(Lit) )
             Abc_InfoXorBit( (unsigned *)pInfo, iBit );
    }
    return 1;
}